

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

char * json_serialize_to_string(JSON_Value *value)

{
  JSON_Status JVar1;
  size_t buf_size_in_bytes;
  char *buf;
  size_t buf_size_bytes;
  JSON_Status serialization_result;
  JSON_Value *value_local;
  
  buf_size_in_bytes = json_serialization_size(value);
  if (buf_size_in_bytes == 0) {
    value_local = (JSON_Value *)0x0;
  }
  else {
    value_local = (JSON_Value *)(*parson_malloc)(buf_size_in_bytes);
    if (value_local == (JSON_Value *)0x0) {
      value_local = (JSON_Value *)0x0;
    }
    else {
      JVar1 = json_serialize_to_buffer(value,(char *)value_local,buf_size_in_bytes);
      if (JVar1 != 0) {
        json_free_serialized_string((char *)value_local);
        value_local = (JSON_Value *)0x0;
      }
    }
  }
  return (char *)value_local;
}

Assistant:

char * json_serialize_to_string(const JSON_Value *value) {
    JSON_Status serialization_result = JSONFailure;
    size_t buf_size_bytes = json_serialization_size(value);
    char *buf = NULL;
    if (buf_size_bytes == 0) {
        return NULL;
    }
    buf = (char*)parson_malloc(buf_size_bytes);
    if (buf == NULL) {
        return NULL;
    }
    serialization_result = json_serialize_to_buffer(value, buf, buf_size_bytes);
    if (serialization_result != JSONSuccess) {
        json_free_serialized_string(buf);
        return NULL;
    }
    return buf;
}